

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::isPageSizesMultiplication
          (SparseTextureClampLookupColorTestCase *this,GLint target,GLint level)

{
  bool bVar1;
  GLint depth;
  GLint height;
  GLint width;
  int local_1c;
  int local_18;
  int local_14;
  
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mState,level,&local_14,&local_18,
             &local_1c);
  if (target == 0x8513) {
    local_1c = local_1c * 6;
  }
  if (((local_14 %
        (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.
        pageSizeX == 0) &&
      (local_18 %
       (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
       super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.pageSizeY
       == 0)) &&
     (local_1c %
      (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.pageSizeZ
      == 0)) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::isPageSizesMultiplication(GLint target, GLint level)
{
	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	if ((width % mState.pageSizeX) == 0 && (height % mState.pageSizeY) == 0 && (depth % mState.pageSizeZ) == 0)
	{
		return true;
	}

	return false;
}